

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

void __thiscall
pzgeom::TPZNodeRep<2,_pztopology::TPZLine>::Print
          (TPZNodeRep<2,_pztopology::TPZLine> *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  
  std::operator<<(out,"Nodeindices: ");
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    std::operator<<(poVar1,' ');
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void Print(std::ostream &out) const
        {
            int nn;
            out << "Nodeindices: ";
            for(nn=0; nn<N; nn++)
            {
                out << fNodeIndexes[nn] << ' ';
            }
            out << std::endl;
        }